

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

void __thiscall
dlib::mfp_kernel_1_base_class<1UL>::swap
          (mfp_kernel_1_base_class<1UL> *this,mfp_kernel_1_base_class<1UL> *item)

{
  mp_base_base *pmVar1;
  void *pvVar2;
  stack_based_memory_block<41UL> *in_RSI;
  stack_based_memory_block<41UL> *in_RDI;
  mfp_kernel_1_base_class<1UL> temp;
  mfp_kernel_1_base_class<1UL> *in_stack_ffffffffffffff88;
  
  mfp_kernel_1_base_class((mfp_kernel_1_base_class<1UL> *)in_RDI,in_stack_ffffffffffffff88);
  destroy_mp_memory((mfp_kernel_1_base_class<1UL> *)0x29feaa);
  pmVar1 = mp((mfp_kernel_1_base_class<1UL> *)0x29feb6);
  pvVar2 = stack_based_memory_block<41UL>::get(in_RSI);
  (*pmVar1->_vptr_mp_base_base[2])(pmVar1,pvVar2);
  destroy_mp_memory((mfp_kernel_1_base_class<1UL> *)0x29fee2);
  pmVar1 = mp((mfp_kernel_1_base_class<1UL> *)0x29feee);
  pvVar2 = stack_based_memory_block<41UL>::get(in_RDI);
  (*pmVar1->_vptr_mp_base_base[2])(pmVar1,pvVar2);
  ~mfp_kernel_1_base_class((mfp_kernel_1_base_class<1UL> *)0x29ff1a);
  return;
}

Assistant:

void swap (
            mfp_kernel_1_base_class& item
        ) 
        {  
            // make a temp copy of item
            mfp_kernel_1_base_class temp(item);

            // destory the stuff in item
            item.destroy_mp_memory();
            // copy *this into item
            mp()->clone(item.mp_memory.get());

            // destory the stuff in this 
            destroy_mp_memory();
            // copy temp into *this
            temp.mp()->clone(mp_memory.get());
        }